

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

peer_class_info * __thiscall
libtorrent::aux::session_impl::get_peer_class
          (peer_class_info *__return_storage_ptr__,session_impl *this,peer_class_t cid)

{
  peer_class *this_00;
  
  __return_storage_ptr__->ignore_unchoke_slots = false;
  __return_storage_ptr__->connection_limit_factor = 0;
  (__return_storage_ptr__->label)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->label).field_2;
  (__return_storage_ptr__->label)._M_string_length = 0;
  (__return_storage_ptr__->label).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->upload_limit = 0;
  __return_storage_ptr__->download_limit = 0;
  __return_storage_ptr__->upload_priority = 0;
  __return_storage_ptr__->download_priority = 0;
  this_00 = peer_class_pool::at(&this->m_classes,cid);
  if (this_00 != (peer_class *)0x0) {
    peer_class::get_info(this_00,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

peer_class_info session_impl::get_peer_class(peer_class_t const cid) const
	{
		peer_class_info ret{};
		peer_class const* pc = m_classes.at(cid);
		// if you hit this assert, you're passing in an invalid cid
		TORRENT_ASSERT_PRECOND(pc);
		if (pc == nullptr)
		{
#if TORRENT_USE_INVARIANT_CHECKS
			// make it obvious that the return value is undefined
			ret.upload_limit = 0xf0f0f0f;
			ret.download_limit = 0xf0f0f0f;
			ret.label.resize(20);
			url_random(span<char>(ret.label));
			ret.ignore_unchoke_slots = false;
			ret.connection_limit_factor = 0xf0f0f0f;
			ret.upload_priority = 0xf0f0f0f;
			ret.download_priority = 0xf0f0f0f;
#endif
			return ret;
		}

		pc->get_info(&ret);
		return ret;
	}